

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorpickermenu.cpp
# Opt level: O0

void __thiscall DColorPickerMenu::Destroy(DColorPickerMenu *this)

{
  UCVarValue value;
  FOptionMenuItem **ppFVar1;
  undefined4 uStack_1c;
  UCVarValue val;
  uint i;
  DColorPickerMenu *this_local;
  
  if (-1 < this->mStartItem) {
    for (val._4_4_ = 0; val._4_4_ < 8; val._4_4_ = val._4_4_ + 1) {
      ppFVar1 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::operator[]
                          (&(((this->super_DOptionMenu).mDesc)->mItems).
                            super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                           (ulong)(uint)(this->mStartItem + val._4_4_));
      if (*ppFVar1 != (FOptionMenuItem *)0x0) {
        (*((*ppFVar1)->super_FListMenuItem)._vptr_FListMenuItem[1])();
      }
      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Resize
                (&(((this->super_DOptionMenu).mDesc)->mItems).
                  super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,this->mStartItem);
    }
    if (this->mCVar != (FColorCVar *)0x0) {
      value._4_4_ = uStack_1c;
      value.Int = (int)this->mRed << 0x10 | (int)this->mGreen << 8 | (int)this->mBlue;
      FBaseCVar::SetGenericRep((FBaseCVar *)this->mCVar,value,CVAR_Int);
    }
    this->mStartItem = -1;
  }
  return;
}

Assistant:

void Destroy() override
	{
		if (mStartItem >= 0)
		{
			for(unsigned i=0;i<8;i++)
			{
				delete mDesc->mItems[mStartItem+i];
				mDesc->mItems.Resize(mStartItem);
			}
			UCVarValue val;
			val.Int = MAKERGB(int(mRed), int(mGreen), int(mBlue));
			if (mCVar != NULL) mCVar->SetGenericRep (val, CVAR_Int);
			mStartItem = -1;
		}
	}